

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Editor.cpp
# Opt level: O0

void __thiscall Editor::editTile(Editor *this,bool toggleState)

{
  byte in_SIL;
  Tile *in_RDI;
  Tile tile;
  unique_ptr<commands::EditTiles,_std::default_delete<commands::EditTiles>_> command_2;
  pair<sf::Vector2<int>,_sf::Vector2<int>_> bounds_1;
  unique_ptr<commands::ToggleTiles,_std::default_delete<commands::ToggleTiles>_> command_1;
  unique_ptr<commands::ToggleTiles,_std::default_delete<commands::ToggleTiles>_> command;
  pair<sf::Vector2<int>,_sf::Vector2<int>_> bounds;
  Vector2i *in_stack_000001b8;
  Editor *in_stack_000001c0;
  Vector2i *in_stack_fffffffffffffef8;
  unique_ptr<commands::ToggleTiles,_std::default_delete<commands::ToggleTiles>_>
  *in_stack_ffffffffffffff00;
  Board *this_00;
  unique_ptr<Command,_std::default_delete<Command>_> *in_stack_ffffffffffffff08;
  unique_ptr<Command,_std::default_delete<Command>_> *command_00;
  Editor *in_stack_ffffffffffffff10;
  Editor *this_01;
  undefined8 in_stack_ffffffffffffff18;
  SubBoard *in_stack_ffffffffffffff20;
  PlaceTiles *in_stack_ffffffffffffff30;
  Board *in_stack_ffffffffffffff38;
  anon_class_8_1_bc00122b in_stack_ffffffffffffff40;
  Editor *in_stack_ffffffffffffff48;
  ToggleTiles *in_stack_ffffffffffffff50;
  undefined1 local_80 [16];
  int local_70;
  unique_ptr<Command,_std::default_delete<Command>_> local_68;
  Board *in_stack_ffffffffffffffa0;
  undefined1 local_50 [60];
  int local_14;
  byte local_9;
  
  local_9 = in_SIL & 1;
  if (local_9 == 0) {
    if (*(int *)((long)&in_RDI[0x1e].tileType_ + 4) == 0) {
      if (((ulong)in_RDI[0x1e].tileType_ & 1) != 0) {
        join_0x00000010_0x00000000_ = Board::getHighlightedBounds(in_stack_ffffffffffffffa0);
        if (local_70 < (int)local_80._8_4_) {
          this_00 = (Board *)local_80;
          makeCommand<commands::EditTiles,Board&,TilePool&>
                    (in_stack_ffffffffffffff48,(Board *)in_stack_ffffffffffffff40.command,
                     (TilePool *)in_stack_ffffffffffffff38);
          std::unique_ptr<commands::EditTiles,_std::default_delete<commands::EditTiles>_>::
          operator->((unique_ptr<commands::EditTiles,_std::default_delete<commands::EditTiles>_> *)
                     0x1915ef);
          commands::PlaceTiles::pushBackTile(in_stack_ffffffffffffff30,(Vector2i *)in_RDI);
          Board::accessTile(this_00,in_stack_fffffffffffffef8);
          Tile::cloneTo((Tile *)in_stack_ffffffffffffff30,in_RDI);
          Tile::alternativeTile((Tile *)0x191641);
          std::unique_ptr<Command,std::default_delete<Command>>::
          unique_ptr<commands::EditTiles,std::default_delete<commands::EditTiles>,void>
                    ((unique_ptr<Command,_std::default_delete<Command>_> *)in_stack_ffffffffffffff10
                     ,(unique_ptr<commands::EditTiles,_std::default_delete<commands::EditTiles>_> *)
                      in_stack_ffffffffffffff08);
          executeCommand(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
          std::unique_ptr<Command,_std::default_delete<Command>_>::~unique_ptr
                    ((unique_ptr<Command,_std::default_delete<Command>_> *)in_stack_ffffffffffffff10
                    );
          std::unique_ptr<commands::EditTiles,_std::default_delete<commands::EditTiles>_>::
          ~unique_ptr((unique_ptr<commands::EditTiles,_std::default_delete<commands::EditTiles>_> *)
                      this_00);
        }
      }
    }
    else if (*(int *)((long)&in_RDI[0x1e].tileType_ + 4) == 1) {
      SubBoard::accessTile
                (in_stack_ffffffffffffff20,(int)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                 (int)in_stack_ffffffffffffff18);
      Tile::alternativeTile((Tile *)0x1916f9);
    }
  }
  else if (*(int *)((long)&in_RDI[0x1e].tileType_ + 4) == 0) {
    if (((ulong)in_RDI[0x1e].tileType_ & 1) != 0) {
      join_0x00000010_0x00000000_ = Board::getHighlightedBounds(in_stack_ffffffffffffffa0);
      if (local_14 < (int)local_50._52_4_) {
        local_50[0x27] = '\0';
        makeCommand<commands::ToggleTiles,Board&,bool>
                  (in_stack_ffffffffffffff48,(Board *)in_stack_ffffffffffffff40.command,
                   (bool *)in_stack_ffffffffffffff38);
        std::unique_ptr<commands::ToggleTiles,_std::default_delete<commands::ToggleTiles>_>::
        operator->((unique_ptr<commands::ToggleTiles,_std::default_delete<commands::ToggleTiles>_> *
                   )0x191342);
        commands::ToggleTiles::pushBackTile
                  (in_stack_ffffffffffffff50,(Vector2i *)in_stack_ffffffffffffff48);
        std::unique_ptr<Command,std::default_delete<Command>>::
        unique_ptr<commands::ToggleTiles,std::default_delete<commands::ToggleTiles>,void>
                  ((unique_ptr<Command,_std::default_delete<Command>_> *)in_stack_ffffffffffffff10,
                   (unique_ptr<commands::ToggleTiles,_std::default_delete<commands::ToggleTiles>_> *
                   )in_stack_ffffffffffffff08);
        executeCommand(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
        std::unique_ptr<Command,_std::default_delete<Command>_>::~unique_ptr
                  ((unique_ptr<Command,_std::default_delete<Command>_> *)in_stack_ffffffffffffff10);
        std::unique_ptr<commands::ToggleTiles,_std::default_delete<commands::ToggleTiles>_>::
        ~unique_ptr(in_stack_ffffffffffffff00);
      }
      else {
        this_01 = (Editor *)local_50;
        makeCommand<commands::ToggleTiles,Board&,bool>
                  (in_stack_ffffffffffffff48,(Board *)in_stack_ffffffffffffff40.command,
                   (bool *)in_stack_ffffffffffffff38);
        (anonymous_namespace)::forEachTile<Editor::editTile(bool)::__0>
                  (in_stack_ffffffffffffff38,(Vector2i *)in_stack_ffffffffffffff30,
                   (Vector2i *)in_RDI,in_stack_ffffffffffffff40);
        command_00 = &local_68;
        std::unique_ptr<Command,std::default_delete<Command>>::
        unique_ptr<commands::ToggleTiles,std::default_delete<commands::ToggleTiles>,void>
                  ((unique_ptr<Command,_std::default_delete<Command>_> *)this_01,
                   (unique_ptr<commands::ToggleTiles,_std::default_delete<commands::ToggleTiles>_> *
                   )command_00);
        executeCommand(this_01,command_00);
        std::unique_ptr<Command,_std::default_delete<Command>_>::~unique_ptr
                  ((unique_ptr<Command,_std::default_delete<Command>_> *)this_01);
        std::unique_ptr<commands::ToggleTiles,_std::default_delete<commands::ToggleTiles>_>::
        ~unique_ptr(in_stack_ffffffffffffff00);
      }
    }
  }
  else if (*(int *)((long)&in_RDI[0x1e].tileType_ + 4) == 1) {
    SubBoard::toggleTileStates(in_stack_ffffffffffffff20);
  }
  else if (*(int *)((long)&in_RDI[0x1e].tileType_ + 4) == 2) {
    SubBoard::toggleTileStates(in_stack_ffffffffffffff20);
  }
  else if (*(int *)((long)&in_RDI[0x1e].tileType_ + 4) == 3) {
    *(byte *)((long)&in_RDI[0x2f].tileType_ + 1) =
         *(byte *)((long)&in_RDI[0x2f].tileType_ + 1) % 2 + 1;
    updateWireTool(in_stack_000001c0,in_stack_000001b8);
  }
  return;
}

Assistant:

void Editor::editTile(bool toggleState) {
    if (toggleState) {
        if (cursorState_ == CursorState::empty) {
            if (!cursorCoords_.second) {
                return;
            }
            auto bounds = board_.getHighlightedBounds();
            if (bounds.first.x > bounds.second.x) {
                // Not toggling a selection.
                auto command = makeCommand<commands::ToggleTiles>(board_, false);
                command->pushBackTile(cursorCoords_.first);
                executeCommand(std::move(command));
            } else {
                // Toggling a selection.
                auto command = makeCommand<commands::ToggleTiles>(board_, true);
                forEachTile(board_, bounds.first, bounds.second, [&command](Chunk& chunk, int i, int x, int y) {
                    Tile tile = chunk.accessTile(i);
                    if (tile.getHighlight()) {
                        command->pushBackTile({x, y});
                    }
                });
                executeCommand(std::move(command));
            }
        } else if (cursorState_ == CursorState::pickTile) {
            tileSubBoard_.toggleTileStates();
        } else if (cursorState_ == CursorState::pasteArea) {
            copySubBoard_.toggleTileStates();
        } else if (cursorState_ == CursorState::wireTool) {
            wireToolWireState_ = static_cast<State::t>((wireToolWireState_ % 2) + 1);
            updateWireTool(cursorCoords_.first);
        }
    } else {
        if (cursorState_ == CursorState::empty) {
            if (!cursorCoords_.second) {
                return;
            }
            auto bounds = board_.getHighlightedBounds();
            if (bounds.first.x > bounds.second.x) {
                // Not editing a selection.
                auto command = makeCommand<commands::EditTiles>(board_, tilePool_);
                Tile tile = command->pushBackTile(cursorCoords_.first);
                board_.accessTile(cursorCoords_.first).cloneTo(tile);
                tile.alternativeTile();
                executeCommand(std::move(command));
            }
        } else if (cursorState_ == CursorState::pickTile) {
            tileSubBoard_.accessTile(0, 0).alternativeTile();
        }
    }
}